

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Input::nextDocument(Input *this)

{
  bool bVar1;
  document_iterator dVar2;
  document_iterator dVar3;
  
  dVar2 = document_iterator::operator++(&this->DocIterator);
  dVar3 = yaml::Stream::end((this->Strm)._M_t.
                            super___uniq_ptr_impl<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Stream_*,_std::default_delete<llvm::yaml::Stream>_>
                            .super__Head_base<0UL,_llvm::yaml::Stream_*,_false>._M_head_impl);
  if ((dVar2.Doc ==
       (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0) ||
     (((dVar2.Doc)->_M_t).
      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>._M_t.
      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>.
      super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl == (Document *)0x0)) {
    if (dVar3.Doc ==
        (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0) {
      bVar1 = true;
    }
    else {
      bVar1 = ((dVar3.Doc)->_M_t).
              super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
              ._M_t.
              super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
              .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl == (Document *)0x0;
    }
  }
  else if (dVar3.Doc ==
           (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = dVar2.Doc == dVar3.Doc &&
            ((dVar3.Doc)->_M_t).
            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>.
            _M_t.
            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl != (Document *)0x0;
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool Input::nextDocument() {
  return ++DocIterator != Strm->end();
}